

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_concept_suite.cpp
# Opt level: O1

void container_suite::container_types(void)

{
  return;
}

Assistant:

void container_types()
{
    static_assert(has_value_type<variable>::value, "variable::value_type missing");

    static_assert(has_reference<variable>::value, "variable::reference missing");
    static_assert(has_const_reference<variable>::value, "variable::const_reference missing");

    static_assert(has_iterator<variable>::value, "variable::iterator missing");
    static_assert(has_const_iterator<variable>::value, "variable::const_iterator missing");

    static_assert(has_difference_type<variable>::value, "variable::difference_type missing");
    static_assert(std::is_signed<variable::difference_type>::value, "variable::difference_type must be signed");
    static_assert(std::is_same<variable::difference_type, variable::iterator::difference_type>::value, "Container and iterator must have same difference_type");
    static_assert(std::is_same<variable::difference_type, variable::const_iterator::difference_type>::value, "Container and const_iterator must have same difference_type");

    static_assert(has_size_type<variable>::value, "variable::size_type missing");
    static_assert(std::is_unsigned<variable::size_type>::value, "variable::size_type must be unsigned");
    static_assert(std::numeric_limits<variable::size_type>::max() >= std::numeric_limits<variable::difference_type>::max(), "size_type can represent any non-negative value of difference_type");
}